

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ScopedMessage::~ScopedMessage(ScopedMessage *this)

{
  char cVar1;
  IResultCapture *pIVar2;
  
  cVar1 = std::uncaught_exception();
  if ((cVar1 == '\0') && (this->m_moved == false)) {
    pIVar2 = getResultCapture();
    (*pIVar2->_vptr_IResultCapture[7])(pIVar2,this);
  }
  std::__cxx11::string::~string((string *)&(this->m_info).message);
  return;
}

Assistant:

ScopedMessage::~ScopedMessage() {
        if ( !uncaught_exceptions() && !m_moved ){
            getResultCapture().popScopedMessage(m_info);
        }
    }